

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.h
# Opt level: O1

int DisconnectPathfinderDVL(PATHFINDERDVL *pPathfinderDVL)

{
  int iVar1;
  timespec req;
  timespec local_18;
  
  local_18.tv_sec = 0;
  local_18.tv_nsec = 100000000;
  nanosleep(&local_18,(timespec *)0x0);
  if (pPathfinderDVL->bSendBreak != 0) {
    iVar1 = SendBreakPathfinderDVL
                      (pPathfinderDVL,pPathfinderDVL->BreakMode,pPathfinderDVL->BreakDuration);
    if (iVar1 != 0) {
      puts("Unable to interrupt a PathfinderDVL : break failed.");
      CloseRS232Port(&pPathfinderDVL->RS232Port);
      return 1;
    }
    local_18.tv_sec = 0;
    local_18.tv_nsec = 500000000;
    nanosleep(&local_18,(timespec *)0x0);
  }
  iVar1 = CloseRS232Port(&pPathfinderDVL->RS232Port);
  if (iVar1 != 0) {
    puts("PathfinderDVL disconnection failed.");
    return 1;
  }
  puts("PathfinderDVL disconnected.");
  return 0;
}

Assistant:

inline int DisconnectPathfinderDVL(PATHFINDERDVL* pPathfinderDVL)
{
	mSleep(100);
	if (pPathfinderDVL->bSendBreak)
	{
		if (SendBreakPathfinderDVL(pPathfinderDVL, pPathfinderDVL->BreakMode, pPathfinderDVL->BreakDuration) != EXIT_SUCCESS)
		{
			printf("Unable to interrupt a PathfinderDVL : break failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(500);
	}
	if (CloseRS232Port(&pPathfinderDVL->RS232Port) != EXIT_SUCCESS)
	{
		printf("PathfinderDVL disconnection failed.\n");
		return EXIT_FAILURE;
	}

	printf("PathfinderDVL disconnected.\n");

	return EXIT_SUCCESS;
}